

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O1

void emit_buffered_bits(huff_entropy_ptr_conflict entropy,char *bufstart,uint nbits)

{
  size_t *psVar1;
  JOCTET *pJVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  
  if ((nbits != 0) && (entropy->gather_statistics == 0)) {
    do {
      if (entropy->gather_statistics == 0) {
        iVar4 = (entropy->saved).put_bits;
        uVar5 = (ulong)((byte)*bufstart & 1) << (0x17U - (char)iVar4 & 0x3f) |
                (entropy->saved).put_buffer;
        if (iVar4 < 7) {
          iVar4 = iVar4 + 1;
        }
        else {
          iVar3 = iVar4 + 9;
          do {
            iVar4 = iVar3;
            pJVar2 = entropy->next_output_byte;
            entropy->next_output_byte = pJVar2 + 1;
            *pJVar2 = (JOCTET)(uVar5 >> 0x10);
            psVar1 = &entropy->free_in_buffer;
            *psVar1 = *psVar1 - 1;
            if (*psVar1 == 0) {
              dump_buffer_e(entropy);
            }
            if ((~(uint)uVar5 & 0xff0000) == 0) {
              pJVar2 = entropy->next_output_byte;
              entropy->next_output_byte = pJVar2 + 1;
              *pJVar2 = '\0';
              psVar1 = &entropy->free_in_buffer;
              *psVar1 = *psVar1 - 1;
              if (*psVar1 == 0) {
                dump_buffer_e(entropy);
              }
            }
            uVar5 = uVar5 << 8;
            iVar3 = iVar4 + -8;
          } while (0xf < iVar3);
          iVar4 = iVar4 + -0x10;
        }
        (entropy->saved).put_buffer = uVar5;
        (entropy->saved).put_bits = iVar4;
      }
      bufstart = (char *)((byte *)bufstart + 1);
      nbits = nbits - 1;
    } while (nbits != 0);
  }
  return;
}

Assistant:

LOCAL(void)
emit_buffered_bits (huff_entropy_ptr entropy, char * bufstart,
		    unsigned int nbits)
{
  if (entropy->gather_statistics)
    return;			/* no real work */

  while (nbits > 0) {
    emit_bits_e(entropy, (unsigned int) (*bufstart), 1);
    bufstart++;
    nbits--;
  }
}